

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

void __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::dump(basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this,ostream *os,bool recursive)

{
  ulong uVar1;
  ulong uVar2;
  basic_node_ptr<unodb::detail::node_header> local_38;
  
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  ::dump((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          *)this,os,recursive);
  uVar2 = (ulong)(byte)this->field_0x8;
  std::__ostream_insert<char,std::char_traits<char>>(os,", key_bytes:",0xc);
  if (uVar2 == 0) {
    if (recursive) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", children:  \n",0xe);
      return;
    }
  }
  else {
    uVar1 = 0;
    do {
      dump_byte(os,*(byte *)((long)(this->children)._M_elems + (uVar1 - 4)));
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
    if ((recursive) &&
       (std::__ostream_insert<char,std::char_traits<char>>(os,", children:  \n",0xe), uVar2 != 0)) {
      uVar1 = 0;
      do {
        local_38.tagged_ptr = (this->children)._M_elems[uVar1].value.tagged_ptr;
        basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
        ::dump_node(os,&local_38,true);
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os,
                                                bool recursive) const {
    parent_class::dump(os, recursive);
    const auto children_count_ = this->children_count.load();
    os << ", key_bytes:";
    for (std::uint8_t i = 0; i < children_count_; i++)
      dump_byte(os, keys.byte_array[i]);
    if (recursive) {
      os << ", children:  \n";
      for (std::uint8_t i = 0; i < children_count_; i++)
        ArtPolicy::dump_node(os, children[i].load());
    }
  }